

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

void print_two_dimensions(int (*nums) [5],int rows,int cols)

{
  ulong uVar1;
  ulong uVar2;
  
  if (0 < rows) {
    uVar2 = 0;
    do {
      if (0 < cols) {
        uVar1 = 0;
        do {
          printf("%i ",(ulong)(uint)(*nums)[uVar1]);
          uVar1 = uVar1 + 1;
        } while ((uint)cols != uVar1);
      }
      uVar2 = uVar2 + 1;
      nums = nums + 1;
    } while (uVar2 != (uint)rows);
  }
  putchar(10);
  return;
}

Assistant:

void print_two_dimensions(int nums[][5], int rows, int cols) {
    for (int r=0; r<rows; r++) {
        for (int c=0; c<cols; c++) {
            printf("%i ", nums[r][c]);
        }
    }
    printf("\n");
}